

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceAllocator.cxx
# Opt level: O0

bool __thiscall
cmCTestResourceAllocator::AllocateResource
          (cmCTestResourceAllocator *this,string *name,string *id,uint slots)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  pointer ppVar4;
  pointer ppVar5;
  _Self local_50;
  _Self local_48;
  iterator resIt;
  _Self local_38;
  iterator it;
  uint slots_local;
  string *id_local;
  string *name_local;
  cmCTestResourceAllocator *this_local;
  
  it._M_node._4_4_ = slots;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>_>_>_>
       ::find(&this->Resources,name);
  resIt._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>_>_>_>
       ::end(&this->Resources);
  bVar3 = std::operator==(&local_38,(_Self *)&resIt);
  if (bVar3) {
    this_local._7_1_ = false;
  }
  else {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>_>_>
             ::operator->(&local_38);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>
         ::find(&ppVar4->second,id);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>_>_>
             ::operator->(&local_38);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>
         ::end(&ppVar4->second);
    bVar3 = std::operator==(&local_48,&local_50);
    if (bVar3) {
      this_local._7_1_ = false;
    }
    else {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>
               ::operator->(&local_48);
      uVar1 = (ppVar5->second).Total;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>
               ::operator->(&local_48);
      uVar2 = it._M_node._4_4_;
      if (uVar1 < (ppVar5->second).Locked + it._M_node._4_4_) {
        this_local._7_1_ = false;
      }
      else {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>
                 ::operator->(&local_48);
        (ppVar5->second).Locked = uVar2 + (ppVar5->second).Locked;
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestResourceAllocator::AllocateResource(const std::string& name,
                                                const std::string& id,
                                                unsigned int slots)
{
  auto it = this->Resources.find(name);
  if (it == this->Resources.end()) {
    return false;
  }

  auto resIt = it->second.find(id);
  if (resIt == it->second.end()) {
    return false;
  }

  if (resIt->second.Total < resIt->second.Locked + slots) {
    return false;
  }

  resIt->second.Locked += slots;
  return true;
}